

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QItemSelectionRange>::reallocateAndGrow
          (QArrayDataPointer<QItemSelectionRange> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QItemSelectionRange> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QItemSelectionRange *pQVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QItemSelectionRange> *)0x0 && where == GrowsAtEnd) &&
       (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QItemSelectionRange>::reallocate
                ((QMovableArrayOps<QItemSelectionRange> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QItemSelectionRange *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      puVar6 = (undefined1 *)local_48.size;
      if (this->size != 0) {
        lVar5 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QItemSelectionRange> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
                    ((QGenericArrayOps<QItemSelectionRange> *)&local_48,this->ptr,this->ptr + lVar5)
          ;
          puVar6 = (undefined1 *)local_48.size;
        }
        else if (0 < lVar5) {
          pQVar3 = this->ptr;
          lVar7 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(pQVar3->tl).d + lVar7);
            uVar4 = *puVar1;
            *puVar1 = 0;
            *(undefined8 *)((long)&local_48.ptr[local_48.size].tl.d + lVar7) = uVar4;
            uVar4 = puVar1[1];
            puVar1[1] = 0;
            *(undefined8 *)((long)&local_48.ptr[local_48.size].br.d + lVar7) = uVar4;
            puVar6 = puVar6 + 1;
            lVar7 = lVar7 + 0x10;
          } while ((QItemSelectionRange *)(puVar1 + 2) < pQVar3 + lVar5);
        }
      }
      local_48.size = (qsizetype)puVar6;
      pDVar2 = this->d;
      pQVar3 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar6 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pQVar3;
      local_48.size = (qsizetype)puVar6;
      if (old != (QArrayDataPointer<QItemSelectionRange> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = pQVar3;
        local_48.size = old->size;
        old->size = (qsizetype)puVar6;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }